

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O1

void TPZShapeHDiv<pzshape::TPZShapeLinear>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  long *plVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  TPZManVector<int,_27> scalarOrders;
  TPZManVector<int,_20> local_150;
  TPZManVector<int,_27> local_c0;
  
  local_150.super_TPZVec<int>.fStore = (int *)0x0;
  local_150.super_TPZVec<int>.fNElements = 0;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840b58;
  uVar8 = ids->fNElements;
  if ((long)uVar8 < 9) {
    local_150.super_TPZVec<int>.fStore = local_150.fExtAlloc;
    local_150.super_TPZVec<int>.fNAlloc = 0;
  }
  else {
    local_150.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8);
    local_150.super_TPZVec<int>.fNAlloc = uVar8;
  }
  if (0 < (long)uVar8) {
    plVar1 = ids->fStore;
    uVar4 = 0;
    do {
      *(long *)(local_150.super_TPZVec<int>.fStore + uVar4 * 2) = plVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar8 != uVar4);
  }
  local_150.super_TPZVec<int>.fNElements = uVar8;
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)&local_150);
  if (local_150.super_TPZVec<int>.fStore == local_150.fExtAlloc) {
    local_150.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_150.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_150.super_TPZVec<int>.fStore);
  }
  local_150.super_TPZVec<int>.fStore = (int *)0x0;
  local_150.super_TPZVec<int>.fNElements = 0;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840040;
  uVar8 = sideorient->fNElements;
  if ((long)uVar8 < 0x15) {
    local_150.super_TPZVec<int>.fStore = local_150.fExtAlloc;
    local_150.super_TPZVec<int>.fNAlloc = 0;
  }
  else {
    local_150.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | uVar8 * 4);
    local_150.super_TPZVec<int>.fNAlloc = uVar8;
  }
  if (0 < (long)uVar8) {
    piVar2 = sideorient->fStore;
    uVar4 = 0;
    do {
      local_150.super_TPZVec<int>.fStore[uVar4] = piVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar8 != uVar4);
  }
  local_150.super_TPZVec<int>.fNElements = uVar8;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,&local_150);
  if (local_150.super_TPZVec<int>.fStore == local_150.fExtAlloc) {
    local_150.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_150.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_150.super_TPZVec<int>.fStore);
  }
  iVar6 = connectorders->fStore[2];
  TPZVec<int>::TPZVec(&local_150.super_TPZVec<int>,0);
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840098;
  local_150.super_TPZVec<int>.fStore = local_150.fExtAlloc;
  local_150.super_TPZVec<int>.fNElements = 1;
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.fExtAlloc[0] = iVar6 + 1;
  TPZShapeH1<pzshape::TPZShapeLinear>::Initialize
            (&(data->fCornerNodeIds).super_TPZVec<long>,&local_150.super_TPZVec<int>,data);
  if (connectorders->fNElements != 3) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x26);
  }
  local_c0.super_TPZVec<int>.fStore = (int *)0x0;
  local_c0.super_TPZVec<int>.fNElements = 0;
  local_c0.super_TPZVec<int>.fNAlloc = 0;
  local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840098;
  uVar8 = connectorders->fNElements;
  if ((long)uVar8 < 0x1c) {
    local_c0.super_TPZVec<int>.fStore = local_c0.fExtAlloc;
    local_c0.super_TPZVec<int>.fNAlloc = 0;
  }
  else {
    local_c0.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | uVar8 * 4);
    local_c0.super_TPZVec<int>.fNAlloc = uVar8;
  }
  if (0 < (long)uVar8) {
    piVar2 = connectorders->fStore;
    uVar4 = 0;
    do {
      local_c0.super_TPZVec<int>.fStore[uVar4] = piVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar8 != uVar4);
  }
  local_c0.super_TPZVec<int>.fNElements = uVar8;
  TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,&local_c0);
  if (local_c0.super_TPZVec<int>.fStore == local_c0.fExtAlloc) {
    local_c0.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_c0.super_TPZVec<int>.fNAlloc = 0;
  local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_c0.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_c0.super_TPZVec<int>.fStore);
  }
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,3);
  piVar2 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore;
  piVar3 = (data->fHDivNumConnectShape).super_TPZVec<int>.fStore;
  lVar5 = 0;
  iVar6 = 0;
  do {
    iVar7 = 1;
    if (lVar5 == 2) {
      iVar7 = piVar2[2];
    }
    piVar3[lVar5] = iVar7;
    iVar6 = iVar6 + iVar7;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar6);
  ComputeMasterDirections(data);
  ComputeVecandShape(data);
  iVar6 = (int)(data->fHDivConnectOrders).super_TPZVec<int>.fNElements;
  if (1 < (long)iVar6) {
    uVar8 = 0;
    do {
      if ((data->fHDivConnectOrders).super_TPZVec<int>.fStore[(long)iVar6 + -1] <
          (data->fHDivConnectOrders).super_TPZVec<int>.fStore[uVar8]) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                   ,0x3e);
      }
      uVar8 = uVar8 + 1;
    } while (iVar6 - 1 != uVar8);
  }
  if (local_150.super_TPZVec<int>.fStore == local_150.fExtAlloc) {
    local_150.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_150.super_TPZVec<int>.fNAlloc = 0;
  local_150.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_150.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_150.super_TPZVec<int>.fStore);
  }
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}